

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int preprocessInputBuffer
              (string *in_file_path,StkFrames *preprocess_buff,double dst_rate,double shifter_weight
              ,int centerBiasLevel,bool use_linearity_correction)

{
  StkFloat *pSVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined7 in_register_00000009;
  uint nFrames;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  StkFloat SVar11;
  StkFrames filtered_shifter_buff;
  StkFrames rectify_buff;
  StkFrames progress_out_buff;
  double local_110;
  StkFrames local_d8;
  StkFrames local_a8;
  string local_78;
  StkFrames local_58;
  
  uVar6 = preprocess_buff->size_;
  dVar2 = (double)centerBiasLevel;
  if ((int)CONCAT71(in_register_00000009,use_linearity_correction) != 0) {
    dVar2 = ((159.79 / (22638.0 / dVar2 + 100.0)) / 0.5771522095) * 128.0;
  }
  dVar3 = (double)(~-(ulong)(63.0 < dVar2) & (ulong)dVar2 |
                  (ulong)(dVar2 + -128.0) & -(ulong)(63.0 < dVar2));
  dVar2 = dVar3 * -0.015625;
  nFrames = (uint)uVar6;
  stk::StkFrames::StkFrames(&local_a8,nFrames,1);
  if ((int)nFrames < 1) {
LAB_001078b7:
    local_110 = 0.0;
  }
  else {
    pSVar1 = preprocess_buff->data_;
    uVar5 = 0;
    do {
      dVar10 = pSVar1[uVar5];
      dVar8 = 0.0;
      if (0.0 <= dVar3) {
        if (dVar10 < dVar2) {
          dVar8 = dVar2 - dVar10;
        }
      }
      else if (dVar2 <= dVar10) {
        dVar8 = dVar10 - dVar2;
      }
      local_a8.data_[uVar5] = dVar8;
      uVar5 = uVar5 + 1;
    } while ((nFrames & 0x7fffffff) != uVar5);
    if ((int)nFrames < 1) goto LAB_001078b7;
    uVar5 = 0x800;
    if (nFrames < 0x800) {
      uVar5 = uVar6 & 0xffffffff;
    }
    local_110 = 0.0;
    uVar6 = 0;
    do {
      local_110 = local_110 + local_a8.data_[uVar6] / (double)(int)uVar5;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
    if (0 < (int)nFrames) {
      if (force_initial_volume < 0) {
        dVar10 = local_110 * 64.0;
      }
      else {
        dVar10 = (double)((uint)force_initial_volume >> 1);
      }
      iVar4 = (int)dVar10 * 2;
      uVar6 = 0;
      do {
        iVar4 = iVar4 + (uint)((double)iVar4 <
                              (double)((ulong)((local_a8.data_[uVar6] * 128.0) / (1.0 - ABS(dVar2)))
                                       & -(ulong)(dVar2 != 1.0) |
                                      ~-(ulong)(dVar2 != 1.0) &
                                      (ulong)(local_a8.data_[uVar6] * 128.0))) * 4 + -2;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        if (0x7e < iVar4) {
          iVar4 = 0x7f;
        }
        local_a8.data_[uVar6] = (double)iVar4 * 0.0078125;
        uVar6 = uVar6 + 1;
      } while ((nFrames & 0x7fffffff) != uVar6);
      dVar10 = exp(-250.0 / dst_rate);
      if (0 < (int)nFrames) {
        uVar6 = 0;
        dVar8 = 0.0;
        do {
          dVar9 = local_a8.data_[uVar6];
          if (dVar9 < dVar8) {
            dVar9 = dVar9 * (1.0 - dVar10) + dVar8 * dVar10;
            local_a8.data_[uVar6] = dVar9;
          }
          uVar6 = uVar6 + 1;
          dVar8 = dVar9;
        } while ((nFrames & 0x7fffffff) != uVar6);
      }
      goto LAB_001078d4;
    }
  }
  exp(-250.0 / dst_rate);
LAB_001078d4:
  stk::StkFrames::StkFrames(&local_d8,nFrames,1);
  firLowpassFilter(&local_a8,&local_d8,20.0 / (dst_rate * 0.5),local_110);
  if (0 < (int)nFrames) {
    uVar6 = 0;
    do {
      local_d8.data_[uVar6] = local_d8.data_[uVar6] + local_d8.data_[uVar6];
      uVar6 = uVar6 + 1;
    } while ((nFrames & 0x7fffffff) != uVar6);
  }
  if (output_envelope != false) {
    stk::StkFrames::StkFrames(&local_58,(uint)local_d8.size_,1);
    if (CONCAT44(local_d8.size_._4_4_,(uint)local_d8.size_) != 0) {
      lVar7 = 0;
      do {
        dVar10 = local_d8.data_[lVar7] * 0.5;
        local_58.data_[lVar7] = dVar10;
        SVar11 = 1.0;
        if ((1.0 < dVar10) || (SVar11 = -1.0, dVar10 < -1.0)) {
          local_58.data_[lVar7] = SVar11;
        }
        lVar7 = lVar7 + 1;
      } while (CONCAT44(local_d8.size_._4_4_,(uint)local_d8.size_) != lVar7);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"_envelope","");
    outputBufferToFile(in_file_path,&local_58,&local_78,dst_rate);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    stk::StkFrames::~StkFrames(&local_58);
  }
  if (0 < (int)nFrames) {
    pSVar1 = preprocess_buff->data_;
    uVar6 = 0;
    do {
      dVar10 = local_d8.data_[uVar6] * shifter_weight;
      local_d8.data_[uVar6] = dVar10;
      pSVar1[uVar6] =
           ((double)(~-(ulong)(dVar3 < 0.0) & (ulong)(dVar10 - dVar2) |
                    (ulong)((2.0 - dVar2) - dVar10) & -(ulong)(dVar3 < 0.0)) + pSVar1[uVar6]) * 0.5;
      uVar6 = uVar6 + 1;
    } while ((nFrames & 0x7fffffff) != uVar6);
    if (use_linearity_correction && 0 < (int)nFrames) {
      pSVar1 = preprocess_buff->data_;
      uVar6 = 0;
      do {
        pSVar1[uVar6] = 22368.0 / ((159.79 / (pSVar1[uVar6] * 0.5771522095) + -100.0) * 128.0);
        uVar6 = uVar6 + 1;
      } while ((nFrames & 0x7fffffff) != uVar6);
    }
  }
  stk::StkFrames::~StkFrames(&local_d8);
  stk::StkFrames::~StkFrames(&local_a8);
  return 0;
}

Assistant:

int preprocessInputBuffer(const std::string &in_file_path,
						  stk::StkFrames &preprocess_buff, double dst_rate,
						  double shifter_weight,
						  int centerBiasLevel, bool use_linearity_correction)
{
	int	src_frames = (int)preprocess_buff.size();
	
	// thresholdの補正
	double centerBiasLevelf = centerBiasLevel;
	if (use_linearity_correction) {
		centerBiasLevelf = 128.0 * linearToDacCurve(centerBiasLevelf);
	}
	
	if (centerBiasLevelf > 63) {
		centerBiasLevelf -= 128;
	}
	double threshold_level = -centerBiasLevelf / 64.0;
	
	// 波形を下半分のみ残して半波整流する
	stk::StkFrames rectify_buff(src_frames, 1);
	for (int i=0; i<src_frames; ++i) {
		if (centerBiasLevelf >= 0) {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = 0;
			}
			else {
				rectify_buff[i] = threshold_level - preprocess_buff[i];
			}
		}
		else {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = preprocess_buff[i] - threshold_level;
			}
			else {
				rectify_buff[i] = 0;
			}
		}
	}
	
	// 先頭2048サンプルの平均値をとって初期値とする
	double start_sample = .0;
	{
		int window_len = (src_frames > 2048)?2048 : src_frames;
		for (int i=0; i<window_len; ++i) {
			start_sample += rectify_buff[i] / static_cast<double>(window_len);
		}
	}
	
	// DPCM変換後に近い波形になるように値が2/128ずつだけ変化するようにする
	{
		int now_sample = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(start_sample * 64.0));
		for (int i=0; i<src_frames; ++i) {
			double target = rectify_buff[i] * 128;
			if (threshold_level != 1.0) {
				target /= 1.0 - std::fabs(threshold_level);
			}
			if (target > now_sample) {
				now_sample += 2;
			}
			else {
				now_sample -= 2;
			}
			if (now_sample < 0) now_sample = 0;
			if (now_sample > 127) now_sample = 127;
			rectify_buff[i] = now_sample / 128.0;
		}
	}
	
	// ピーク&ホールド
	{
		double env = .0;
		double coeffRR = std::exp(-250.0 / dst_rate);
		for (int i=0; i<src_frames; ++i) {
			if (rectify_buff[i] >= env) {
				env = rectify_buff[i];
			}
			else {
				env *= coeffRR;
				env += (1.0 - coeffRR) * rectify_buff[i];
				rectify_buff[i] = env;
			}
		}
	}
	
//	{
//		stk::StkFrames	progress_out_buff((uint32_t)rectify_buff.size(), 1);
//		for (size_t i=0; i<rectify_buff.size(); ++i) {
//			progress_out_buff[i] = rectify_buff[i];
//			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
//			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
//		}
//		outputBufferToFile(in_file_path, progress_out_buff, "_rectify", dst_rate);
//	}
	
	// 整流波形にLPFを掛けて可聴成分を除去
	stk::StkFrames	filtered_shifter_buff(src_frames, 1);
	firLowpassFilter(rectify_buff,
					 filtered_shifter_buff,
					 20.0 / (dst_rate/2),
					 start_sample);
	// ゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= 2.0;
	}
	
	if (output_envelope) {
		// エンベロープ波形
		stk::StkFrames	progress_out_buff((uint32_t)filtered_shifter_buff.size(), 1);
		for (size_t i=0; i<filtered_shifter_buff.size(); ++i) {
			progress_out_buff[i] = filtered_shifter_buff[i] * 0.5;
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_path, progress_out_buff, "_envelope", dst_rate);
	}
	
	// 平滑された整流波形を加算してゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= shifter_weight;
		if (centerBiasLevelf >= 0) {
			preprocess_buff[i] += filtered_shifter_buff[i] - threshold_level;
		}
		else {
			preprocess_buff[i] += 2.0 - threshold_level - filtered_shifter_buff[i];
		}
		preprocess_buff[i] *= 0.5;		// シフトによって倍になったピークを1.0に落とす
	}
	
	// 非線形DAC特性の補正
	if (use_linearity_correction) {
		for (int i=0; i<src_frames; ++i) {
			preprocess_buff[i] = 22368.0 / (128 * ((159.79 / (0.5771522095 * preprocess_buff[i])) - 100));
		}
	}
	
	return 0;
}